

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  char cVar1;
  void *pvVar2;
  byte bVar3;
  u16 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  Mem *pMem;
  uint uVar9;
  u32 serial_type;
  u32 szHdr;
  uint local_54;
  uint local_50;
  uint local_4c;
  UnpackedRecord *local_48;
  KeyInfo *local_40;
  void *local_38;
  
  pMem = p->aMem;
  p->default_rc = '\0';
  local_48 = p;
  local_40 = pKeyInfo;
  if (*pKey < '\0') {
    bVar3 = sqlite3GetVarint32((uchar *)pKey,&local_50);
    uVar6 = (uint)bVar3;
  }
  else {
    uVar6 = 1;
    local_50 = (int)*pKey;
  }
  uVar4 = 0;
  local_4c = local_50;
  uVar5 = local_50;
  local_38 = pKey;
  do {
    pvVar2 = local_38;
    if ((local_4c <= uVar6) || ((uint)nKey < uVar5)) break;
    cVar1 = *(char *)((long)local_38 + (ulong)uVar6);
    if (cVar1 < '\0') {
      bVar3 = sqlite3GetVarint32((uchar *)((ulong)uVar6 + (long)local_38),&local_54);
      uVar9 = (uint)bVar3;
    }
    else {
      uVar9 = 1;
      local_54 = (int)cVar1;
    }
    uVar7 = local_54;
    pMem->enc = local_40->enc;
    pMem->db = local_40->db;
    pMem->szMalloc = 0;
    pMem->z = (char *)0x0;
    uVar8 = (ulong)local_54;
    sqlite3VdbeSerialGet((uchar *)((ulong)uVar5 + (long)pvVar2),local_54,pMem);
    if (uVar8 < 0x80) {
      uVar7 = (uint)""[uVar8];
    }
    else {
      uVar7 = uVar7 - 0xc >> 1;
    }
    uVar6 = uVar6 + uVar9;
    uVar5 = uVar5 + uVar7;
    pMem = pMem + 1;
    uVar4 = uVar4 + 1;
  } while (uVar4 < local_48->nField);
  if (uVar4 != 0 && (uint)nKey < uVar5) {
    if ((pMem[-1].flags & 0x9000) == 0) {
      pMem[-1].flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem + -1);
    }
  }
  local_48->nField = uVar4;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  u32 d;
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=(u32)nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    d += sqlite3VdbeSerialTypeLen(serial_type);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  if( d>(u32)nKey && u ){
    assert( CORRUPT_DB );
    /* In a corrupt record entry, the last pMem might have been set up using
    ** uninitialized memory. Overwrite its value with NULL, to prevent
    ** warnings from MSAN. */
    sqlite3VdbeMemSetNull(pMem-1);
  }
  assert( u<=pKeyInfo->nKeyField + 1 );
  p->nField = u;
}